

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_def.c
# Opt level: O0

_Bool upb_MessageDef_FindByNameWithSize
                (upb_MessageDef *m,char *name,size_t len,upb_FieldDef **out_f,upb_OneofDef **out_o)

{
  _Bool _Var1;
  upb_FieldDef *puVar2;
  void *pvVar3;
  bool local_51;
  upb_OneofDef *o;
  upb_FieldDef *f;
  upb_value val;
  upb_OneofDef **out_o_local;
  upb_FieldDef **out_f_local;
  size_t len_local;
  char *name_local;
  upb_MessageDef *m_local;
  
  val.val = (uint64_t)out_o;
  _Var1 = upb_strtable_lookup2(&m->ntof,name,len,(upb_value *)&f);
  if (_Var1) {
    puVar2 = (upb_FieldDef *)_upb_DefType_Unpack((upb_value)f,UPB_DEFTYPE_EXT);
    pvVar3 = _upb_DefType_Unpack((upb_value)f,UPB_DEFTYPE_MSG);
    if (out_f != (upb_FieldDef **)0x0) {
      *out_f = puVar2;
    }
    if (val.val != 0) {
      *(void **)val.val = pvVar3;
    }
    local_51 = puVar2 != (upb_FieldDef *)0x0 || pvVar3 != (void *)0x0;
    m_local._7_1_ = local_51;
  }
  else {
    m_local._7_1_ = false;
  }
  return m_local._7_1_;
}

Assistant:

bool upb_MessageDef_FindByNameWithSize(const upb_MessageDef* m,
                                       const char* name, size_t len,
                                       const upb_FieldDef** out_f,
                                       const upb_OneofDef** out_o) {
  upb_value val;

  if (!upb_strtable_lookup2(&m->ntof, name, len, &val)) {
    return false;
  }

  const upb_FieldDef* f = _upb_DefType_Unpack(val, UPB_DEFTYPE_FIELD);
  const upb_OneofDef* o = _upb_DefType_Unpack(val, UPB_DEFTYPE_ONEOF);
  if (out_f) *out_f = f;
  if (out_o) *out_o = o;
  return f || o; /* False if this was a JSON name. */
}